

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetBorderRoutersInNetwork
          (Registry *this,uint64_t aXpan,BorderRouterArray *aRet)

{
  Status SVar1;
  int iVar2;
  Network nwk;
  BorderRouter pred;
  Network local_200;
  BorderRouter local_1a0;
  
  Network::Network(&local_200);
  BorderRouter::BorderRouter(&local_1a0);
  SVar1 = GetNetworkByXpan(this,aXpan,&local_200);
  if (SVar1 == kSuccess) {
    local_1a0.mNetworkId.mId = local_200.mId.mId;
    iVar2 = (*this->mStorage->_vptr_PersistentStorage[0x17])(this->mStorage,&local_1a0,aRet);
    SVar1 = kNotFound;
    if ((char)iVar2 != '\x01') {
      SVar1 = ((char)iVar2 != '\0') << 2;
    }
  }
  local_1a0._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_0039ff00;
  BorderAgent::~BorderAgent(&local_1a0.mAgent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.mMlp._M_dataplus._M_p != &local_200.mMlp.field_2) {
    operator_delete(local_200.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.mName._M_dataplus._M_p != &local_200.mName.field_2) {
    operator_delete(local_200.mName._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

Registry::Status Registry::GetBorderRoutersInNetwork(uint64_t aXpan, BorderRouterArray &aRet)
{
    Network          nwk;
    BorderRouter     pred;
    Registry::Status status = GetNetworkByXpan(aXpan, nwk);

    VerifyOrExit(status == Registry::Status::kSuccess);
    pred.mNetworkId = nwk.mId;
    status          = MapStatus(mStorage->Lookup(pred, aRet));
exit:
    return status;
}